

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::UInt32Size(RepeatedField<unsigned_int> *value)

{
  int iVar1;
  uint *puVar2;
  int index;
  size_t sVar3;
  int iVar4;
  
  sVar3 = 0;
  iVar4 = *(int *)value;
  if (*(int *)value < 1) {
    iVar4 = 0;
  }
  for (index = 0; iVar4 != index; index = index + 1) {
    puVar2 = RepeatedField<unsigned_int>::Get(value,index);
    iVar1 = 0x1f;
    if ((*puVar2 | 1) != 0) {
      for (; (*puVar2 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6);
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::UInt32Size(const RepeatedField<uint32>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += UInt32Size(value.Get(i));
  }
  return out;
}